

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
SetInstance::op_contains
          (string *__return_storage_ptr__,SetInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  iterator iVar1;
  undefined8 *puVar2;
  char *pcVar3;
  allocator local_29;
  shared_ptr<Instance> instance;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x20) {
    get_shared_instance((string *)&instance,&this->_element_type);
    iVar1 = std::
            _Rb_tree<std::shared_ptr<Instance>,_std::shared_ptr<Instance>,_std::_Identity<std::shared_ptr<Instance>_>,_InstanceIsLessThanComparator,_std::allocator<std::shared_ptr<Instance>_>_>
            ::find(&(this->_value)._M_t,(key_type *)&instance);
    pcVar3 = "true";
    if ((_Rb_tree_header *)iVar1._M_node == &(this->_value)._M_t._M_impl.super__Rb_tree_header) {
      pcVar3 = "false";
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_29);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::string SetInstance::op_contains(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    return (_value.find(instance) != _value.end()) ? "true" : "false";
}